

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O2

UStringTrieResult __thiscall
icu_63::BytesTrie::branchNext(BytesTrie *this,uint8_t *pos,int32_t length,int32_t inByte)

{
  byte bVar1;
  UStringTrieResult UVar2;
  byte *pbVar3;
  byte *pos_00;
  uint uVar4;
  int iVar5;
  
  if (length == 0) {
    length = (int32_t)*pos;
    pos = pos + 1;
  }
  uVar4 = length + 1;
  while (5 < (int)uVar4) {
    if (inByte < (int)(uint)*pos) {
      pos = jumpByDelta(pos + 1);
      uVar4 = uVar4 >> 1;
    }
    else {
      uVar4 = uVar4 - (uVar4 >> 1);
      pos = skipDelta(pos + 1);
    }
  }
  iVar5 = uVar4 + 1;
  do {
    pos_00 = pos + 1;
    if ((uint)*pos == inByte) {
      bVar1 = *pos_00;
      if ((bVar1 & 1) == 0) {
        if (bVar1 < 0xa2) {
          pbVar3 = pos + 2;
          uVar4 = (bVar1 >> 1) - 0x10;
        }
        else if (bVar1 < 0xd8) {
          pbVar3 = pos + 3;
          uVar4 = ((uint)bVar1 * 0x80 + (uint)pos[2]) - 0x5100;
        }
        else if (bVar1 < 0xfc) {
          uVar4 = ((uint)pos[3] + (uint)pos[2] * 0x100 + (uint)bVar1 * 0x8000) - 0x6c0000;
          pbVar3 = pos + 4;
        }
        else if (bVar1 == 0xfc) {
          uVar4 = (uint)pos[3] << 8 | (uint)pos[2] << 0x10 | (uint)pos[4];
          pbVar3 = pos + 5;
        }
        else {
          uVar4 = (uint)pos[5] | (uint)pos[4] << 8 | (uint)pos[3] << 0x10 | (uint)pos[2] << 0x18;
          pbVar3 = pos + 6;
        }
        pos_00 = pbVar3 + (int)uVar4;
        if (pbVar3[(int)uVar4] < 0x20) {
          UVar2 = USTRINGTRIE_NO_VALUE;
        }
        else {
          UVar2 = pbVar3[(int)uVar4] & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
        }
      }
      else {
        UVar2 = USTRINGTRIE_FINAL_VALUE;
      }
      this->pos_ = pos_00;
      return UVar2;
    }
    pos = skipValue(pos_00);
    iVar5 = iVar5 + -1;
  } while (2 < iVar5);
  if ((uint)*pos == inByte) {
    this->pos_ = pos + 1;
    if (pos[1] < 0x20) {
      UVar2 = USTRINGTRIE_NO_VALUE;
    }
    else {
      UVar2 = pos[1] & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
    }
  }
  else {
    this->pos_ = (uint8_t *)0x0;
    UVar2 = USTRINGTRIE_NO_MATCH;
  }
  return UVar2;
}

Assistant:

UStringTrieResult
BytesTrie::branchNext(const uint8_t *pos, int32_t length, int32_t inByte) {
    // Branch according to the current byte.
    if(length==0) {
        length=*pos++;
    }
    ++length;
    // The length of the branch is the number of bytes to select from.
    // The data structure encodes a binary search.
    while(length>kMaxBranchLinearSubNodeLength) {
        if(inByte<*pos++) {
            length>>=1;
            pos=jumpByDelta(pos);
        } else {
            length=length-(length>>1);
            pos=skipDelta(pos);
        }
    }
    // Drop down to linear search for the last few bytes.
    // length>=2 because the loop body above sees length>kMaxBranchLinearSubNodeLength>=3
    // and divides length by 2.
    do {
        if(inByte==*pos++) {
            UStringTrieResult result;
            int32_t node=*pos;
            U_ASSERT(node>=kMinValueLead);
            if(node&kValueIsFinal) {
                // Leave the final value for getValue() to read.
                result=USTRINGTRIE_FINAL_VALUE;
            } else {
                // Use the non-final value as the jump delta.
                ++pos;
                // int32_t delta=readValue(pos, node>>1);
                node>>=1;
                int32_t delta;
                if(node<kMinTwoByteValueLead) {
                    delta=node-kMinOneByteValueLead;
                } else if(node<kMinThreeByteValueLead) {
                    delta=((node-kMinTwoByteValueLead)<<8)|*pos++;
                } else if(node<kFourByteValueLead) {
                    delta=((node-kMinThreeByteValueLead)<<16)|(pos[0]<<8)|pos[1];
                    pos+=2;
                } else if(node==kFourByteValueLead) {
                    delta=(pos[0]<<16)|(pos[1]<<8)|pos[2];
                    pos+=3;
                } else {
                    delta=(pos[0]<<24)|(pos[1]<<16)|(pos[2]<<8)|pos[3];
                    pos+=4;
                }
                // end readValue()
                pos+=delta;
                node=*pos;
                result= node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
            }
            pos_=pos;
            return result;
        }
        --length;
        pos=skipValue(pos);
    } while(length>1);
    if(inByte==*pos++) {
        pos_=pos;
        int32_t node=*pos;
        return node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
    } else {
        stop();
        return USTRINGTRIE_NO_MATCH;
    }
}